

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O0

unsigned_long __thiscall
cmELFInternalImpl<cmELFTypes32>::GetDynamicEntryPosition
          (cmELFInternalImpl<cmELFTypes32> *this,int j)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  ELF_Shdr *sec;
  int j_local;
  cmELFInternalImpl<cmELFTypes32> *this_local;
  
  bVar1 = LoadDynamicSection(this);
  if (((bVar1) && (-1 < j)) &&
     (sVar2 = std::vector<Elf32_Dyn,_std::allocator<Elf32_Dyn>_>::size(&this->DynamicSectionEntries)
     , j < (int)sVar2)) {
    pvVar3 = std::vector<Elf32_Shdr,_std::allocator<Elf32_Shdr>_>::operator[]
                       (&this->SectionHeaders,(long)(this->super_cmELFInternal).DynamicSectionIndex)
    ;
    return (ulong)(pvVar3->sh_offset + pvVar3->sh_entsize * j);
  }
  return 0;
}

Assistant:

unsigned long cmELFInternalImpl<Types>::GetDynamicEntryPosition(int j)
{
  if (!this->LoadDynamicSection()) {
    return 0;
  }
  if (j < 0 || j >= static_cast<int>(this->DynamicSectionEntries.size())) {
    return 0;
  }
  ELF_Shdr const& sec = this->SectionHeaders[this->DynamicSectionIndex];
  return static_cast<unsigned long>(sec.sh_offset + sec.sh_entsize * j);
}